

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_sse41_128_64.c
# Opt level: O3

parasail_result_t *
parasail_nw_stats_table_diag_sse41_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  int64_t iVar7;
  int64_t iVar8;
  ulong uVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  undefined1 auVar14 [16];
  parasail_result_t *ppVar15;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  int iVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  long lVar30;
  uint uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  bool bVar35;
  ulong uVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  long lVar48;
  undefined1 auVar49 [16];
  long lVar54;
  long lVar55;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  int64_t iVar62;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  __m128i_64_t B;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  long lVar67;
  long lVar68;
  undefined4 uVar72;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  long lVar73;
  __m128i_64_t B_7;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  __m128i_64_t B_6;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  __m128i_64_t B_1;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ulong uVar86;
  long lVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  __m128i_64_t B_3;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 local_2b8 [16];
  long local_2a8;
  long lStack_2a0;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_258 [16];
  ulong uStack_240;
  long local_238;
  long lStack_230;
  undefined1 local_228 [16];
  ulong uStack_210;
  int64_t local_208;
  undefined8 uStack_200;
  undefined1 local_1f8 [16];
  int64_t local_1c8;
  undefined8 uStack_1c0;
  long lStack_160;
  ulong uStack_150;
  long lStack_120;
  ulong uStack_110;
  long local_d8;
  ulong uVar25;
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_table_diag_sse41_128_64_cold_8();
    return (parasail_result_t *)0x0;
  }
  uVar25 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_nw_stats_table_diag_sse41_128_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_nw_stats_table_diag_sse41_128_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_nw_stats_table_diag_sse41_128_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_nw_stats_table_diag_sse41_128_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 1) {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_table_diag_sse41_128_64_cold_3();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    if (_s1 == (char *)0x0) {
      parasail_nw_stats_table_diag_sse41_128_64_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_nw_stats_table_diag_sse41_128_64_cold_1();
      return (parasail_result_t *)0x0;
    }
    if (matrix->type == 0) goto LAB_006db3e3;
  }
  _s1Len = matrix->length;
LAB_006db3e3:
  iVar17 = matrix->min;
  iVar26 = -open;
  uVar34 = 0x8000000000000000 - (long)iVar17;
  if (iVar17 != iVar26 && SBORROW4(iVar17,iVar26) == iVar17 + open < 0) {
    uVar34 = (ulong)(uint)open | 0x8000000000000000;
  }
  iVar17 = matrix->max;
  ppVar15 = parasail_result_new_table3(_s1Len,s2Len);
  if (ppVar15 != (parasail_result_t *)0x0) {
    ppVar15->flag = ppVar15->flag | 0x2831001;
    ptr = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
    uVar18 = (ulong)(s2Len + 2);
    ptr_00 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_01 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_02 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_03 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_04 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_05 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_06 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_07 = parasail_memalign_int64_t(0x10,uVar18);
    ptr_08 = parasail_memalign_int64_t(0x10,uVar18);
    auVar37._0_8_ = -(ulong)(ptr == (int64_t *)0x0);
    auVar37._8_8_ = -(ulong)(ptr_00 == (int64_t *)0x0);
    auVar56._0_8_ = -(ulong)(ptr_01 == (int64_t *)0x0);
    auVar56._8_8_ = -(ulong)(ptr_02 == (int64_t *)0x0);
    auVar37 = packssdw(auVar37,auVar56);
    auVar91._0_8_ = -(ulong)(ptr_03 == (int64_t *)0x0);
    auVar91._8_8_ = -(ulong)(ptr_04 == (int64_t *)0x0);
    auVar81._0_8_ = -(ulong)(ptr_05 == (int64_t *)0x0);
    auVar81._8_8_ = -(ulong)(ptr_06 == (int64_t *)0x0);
    auVar56 = packssdw(auVar91,auVar81);
    auVar37 = packssdw(auVar37,auVar56);
    if ((ptr_08 != (int64_t *)0x0 && ptr_07 != (int64_t *)0x0) &&
        ((((((((((((((((auVar37 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                      (auVar37 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar37 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar37 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar37 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar37 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar37 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar37 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar37 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar37 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar37 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar37 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar37 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar37 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar37 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar37[0xf]))
    {
      uVar18 = uVar34 + 1;
      lVar21 = 0x7ffffffffffffffe - (long)iVar17;
      lVar32 = (long)_s1Len;
      lVar1 = lVar32 + -1;
      lVar2 = uVar25 - 1;
      lVar22 = (long)iVar26;
      local_2a8 = (long)(iVar26 - gap);
      if (0 < _s1Len) {
        piVar4 = matrix->mapper;
        lVar23 = 0;
        do {
          ptr[lVar23] = (long)piVar4[(byte)_s1[lVar23]];
          lVar23 = lVar23 + 1;
        } while (lVar32 != lVar23);
      }
      uVar16 = _s1Len - 1;
      iVar17 = s2Len + -1;
      auVar74._8_4_ = (int)uVar18;
      auVar74._0_8_ = uVar18;
      auVar74._12_4_ = (int)(uVar18 >> 0x20);
      uVar72 = (undefined4)((ulong)lVar21 >> 0x20);
      local_1f8._8_4_ = (int)lVar21;
      local_1f8._0_8_ = lVar21;
      local_1f8._12_4_ = uVar72;
      auVar38._8_4_ = (int)lVar1;
      auVar38._0_8_ = lVar1;
      auVar38._12_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar39._8_4_ = (int)lVar2;
      auVar39._0_8_ = lVar2;
      auVar39._12_4_ = (int)((ulong)lVar2 >> 0x20);
      ptr[lVar32] = 0;
      piVar4 = matrix->mapper;
      uVar24 = 0;
      do {
        ptr_00[uVar24 + 1] = (long)piVar4[(byte)_s2[uVar24]];
        uVar24 = uVar24 + 1;
      } while (uVar25 != uVar24);
      *ptr_00 = 0;
      ptr_00[uVar25 + 1] = 0;
      uVar24 = (ulong)(uint)gap;
      uVar27 = 0;
      lVar23 = lVar22;
      do {
        ptr_01[uVar27 + 1] = lVar23;
        ptr_02[uVar27 + 1] = 0;
        ptr_03[uVar27 + 1] = 0;
        ptr_04[uVar27 + 1] = 0;
        ptr_05[uVar27 + 1] = uVar18;
        ptr_06[uVar27 + 1] = 0;
        ptr_07[uVar27 + 1] = 0;
        ptr_08[uVar27 + 1] = 0;
        uVar27 = uVar27 + 1;
        lVar23 = lVar23 - uVar24;
      } while (uVar25 != uVar27);
      *ptr_02 = 0;
      *ptr_03 = 0;
      *ptr_04 = 0;
      *ptr_05 = 0;
      *ptr_06 = 0;
      *ptr_07 = 0;
      *ptr_08 = 0;
      ptr_01[uVar25 + 1] = 0;
      ptr_02[uVar25 + 1] = 0;
      ptr_03[uVar25 + 1] = 0;
      ptr_04[uVar25 + 1] = 0;
      ptr_05[uVar25 + 1] = 0;
      ptr_06[uVar25 + 1] = 0;
      ptr_07[uVar25 + 1] = 0;
      ptr_08[uVar25 + 1] = 0;
      *ptr_01 = 0;
      auVar37 = auVar74;
      auVar56 = auVar74;
      auVar91 = auVar74;
      local_2b8 = auVar74;
      local_258 = auVar74;
      if (0 < _s1Len) {
        piVar4 = matrix->matrix;
        lVar23 = uVar25 * 4 + -4;
        auVar49 = pmovsxbq(ZEXT416((uint)gap),1);
        lVar30 = 0;
        uVar27 = 0;
        lStack_2a0 = lVar22;
        do {
          uVar36 = ptr[uVar27];
          uVar5 = ptr[uVar27 + 1];
          uVar31 = uVar16;
          if ((long)(uVar27 | 1) < lVar32) {
            uVar31 = (uint)uVar27 | 1;
          }
          iVar26 = matrix->size;
          uVar33 = (ulong)(int)uVar31;
          uVar13 = uVar27;
          if (matrix->type == 0) {
            uVar33 = uVar5;
            uVar13 = uVar36;
          }
          uVar3 = uVar27 + 2;
          iVar62 = *ptr_01;
          *ptr_01 = lVar22 - uVar3 * uVar24;
          auVar77._8_8_ = 0;
          auVar77._0_8_ = lVar22 - uVar27 * uVar24;
          auVar77 = auVar77 << 0x40;
          lStack_160 = auVar38._8_8_;
          lVar54 = auVar49._8_8_;
          uVar19 = 0;
          uStack_240 = auVar74._8_8_;
          uStack_210 = uStack_240;
          local_238 = -1;
          lStack_230 = 0;
          local_288 = ZEXT816(0);
          uStack_1c0 = 0;
          auVar75 = (undefined1  [16])0x0;
          auVar70 = ZEXT816(0);
          auVar81 = ZEXT816(0);
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar18;
          local_228 = auVar63 << 0x40;
          uStack_200 = 0;
          auVar63 = (undefined1  [16])0x0;
          auVar92 = (undefined1  [16])0x0;
          auVar69 = (undefined1  [16])0x0;
          local_298 = (undefined1  [16])0x0;
          uVar86 = uVar18;
          lVar73 = 0;
          lVar48 = 0;
          lVar55 = 0;
          lVar67 = 0;
          lVar68 = 0;
          do {
            lVar87 = auVar77._8_8_;
            lVar6 = ptr_01[uVar19 + 1];
            auVar94._0_8_ = auVar69._8_8_;
            iVar7 = ptr_02[uVar19 + 1];
            auVar94._8_8_ = iVar7;
            auVar76._0_8_ = auVar92._8_8_;
            auVar76._8_8_ = ptr_03[uVar19 + 1];
            auVar64._0_8_ = auVar63._8_8_;
            iVar8 = ptr_04[uVar19 + 1];
            auVar64._8_8_ = iVar8;
            auVar80._8_8_ = ptr_06[uVar19 + 1];
            auVar80._0_8_ = uStack_1c0;
            auVar66._8_8_ = ptr_07[uVar19 + 1];
            auVar66._0_8_ = uStack_200;
            auVar89._8_8_ = ptr_08[uVar19 + 1];
            auVar89._0_8_ = local_288._8_8_;
            auVar88._0_8_ = lVar87 - (ulong)(uint)open;
            auVar88._8_8_ = lVar6 - (ulong)(uint)open;
            uStack_110 = (ulong)(uint)gap;
            auVar83._0_8_ = uVar86 - (uint)gap;
            auVar83._8_8_ = ptr_05[uVar19 + 1] - uStack_110;
            auVar85._0_8_ = -(ulong)(auVar83._0_8_ < auVar88._0_8_);
            auVar85._8_8_ = -(ulong)(auVar83._8_8_ < auVar88._8_8_);
            auVar80 = blendvpd(auVar80,auVar94,auVar85);
            auVar84 = blendvpd(auVar66,auVar76,auVar85);
            auVar90 = blendvpd(auVar89,auVar64,auVar85);
            local_d8 = auVar77._0_8_;
            auVar93._0_8_ = local_d8 - (ulong)(uint)open;
            auVar93._8_8_ = lVar87 - (ulong)(uint)open;
            auVar65._0_8_ = local_228._0_8_ - (ulong)(uint)gap;
            auVar65._8_8_ = local_228._8_8_ - uStack_110;
            auVar57._0_8_ = -(ulong)(auVar65._0_8_ < auVar93._0_8_);
            auVar57._8_8_ = -(ulong)(auVar65._8_8_ < auVar93._8_8_);
            auVar81 = blendvpd(auVar81,auVar69,auVar57);
            auVar70 = blendvpd(auVar70,auVar92,auVar57);
            auVar63 = blendvpd(auVar75,auVar63,auVar57);
            uVar9 = ptr_00[uVar19 + 1];
            iVar20 = piVar4[uVar13 * (long)iVar26 + uVar9];
            iVar29 = piVar4[uVar33 * (long)iVar26 + ptr_00[uVar19]];
            auVar85 = blendvpd(auVar83,auVar88,auVar85);
            auVar50._0_8_ = iVar29 + lVar73;
            auVar50._8_8_ = iVar20 + iVar62;
            auVar92._0_4_ = -(uint)(0 < iVar29);
            auVar92._4_4_ = -(uint)(0 < iVar20);
            auVar92._8_8_ = 0;
            auVar77 = pmovzxdq(auVar76,auVar92);
            auVar78._0_8_ = SUB168(auVar77 & _DAT_009050f0,0) + local_298._0_8_;
            auVar78._8_8_ = SUB168(auVar77 & _DAT_009050f0,8) + local_298._8_8_;
            auVar66 = blendvpd(auVar65,auVar93,auVar57);
            auVar69._0_8_ = -(ulong)(auVar66._0_8_ < auVar50._0_8_);
            auVar69._8_8_ = -(ulong)(auVar66._8_8_ < auVar50._8_8_);
            auVar77 = blendvpd(auVar66,auVar50,auVar69);
            auVar58._0_8_ = -(ulong)(auVar85._0_8_ < auVar77._0_8_);
            uVar86 = auVar85._8_8_;
            auVar58._8_8_ = -(ulong)((long)uVar86 < auVar77._8_8_);
            auVar93 = blendvpd(auVar85,auVar77,auVar58);
            auVar77 = blendvpd(auVar80,auVar81,auVar58);
            auVar51._0_8_ = -(ulong)(auVar50._0_8_ == auVar93._0_8_);
            auVar51._8_8_ = -(ulong)(auVar50._8_8_ == auVar93._8_8_);
            auVar82._0_8_ = lVar67 + (ulong)(uVar5 == uStack_210);
            auVar82._8_8_ = lVar68 + (ulong)(uVar36 == uVar9);
            auVar69 = blendvpd(auVar77,auVar82,auVar51);
            auVar77 = blendvpd(auVar84,auVar70,auVar58);
            auVar92 = blendvpd(auVar77,auVar78,auVar51);
            auVar71._8_4_ = 0xffffffff;
            auVar71._0_8_ = 0xffffffffffffffff;
            auVar71._12_4_ = 0xffffffff;
            local_288._0_8_ = auVar90._0_8_ + 1;
            lVar73 = auVar71._8_8_;
            local_288._8_8_ = auVar90._8_8_ - lVar73;
            auVar75._0_8_ = auVar63._0_8_ + 1;
            auVar75._8_8_ = auVar63._8_8_ - lVar73;
            auVar77 = blendvpd(local_288,auVar75,auVar58);
            auVar79._0_8_ = lVar48 + 1;
            auVar79._8_8_ = lVar55 - lVar73;
            auVar59._8_4_ = 0xffffffff;
            auVar59._0_8_ = 0xffffffffffffffff;
            auVar59._12_4_ = 0xffffffff;
            auVar63 = blendvpd(auVar77,auVar79,auVar51);
            auVar52._0_8_ = -(ulong)(local_238 == -1);
            auVar52._8_8_ = -(ulong)(lStack_230 == auVar59._8_8_);
            auVar90._8_8_ = lStack_2a0;
            auVar90._0_8_ = local_2a8;
            auVar77 = blendvpd(auVar93,auVar90,auVar52);
            auVar69 = ~auVar52 & auVar69;
            auVar92 = ~auVar52 & auVar92;
            auVar63 = ~auVar52 & auVar63;
            local_228 = blendvpd(auVar66,auVar74,auVar52);
            lVar73 = auVar77._0_8_;
            if (1 < uVar19) {
              auVar40._0_8_ = -(ulong)(local_1f8._0_8_ < lVar73);
              auVar40._8_8_ = -(ulong)(local_1f8._8_8_ < auVar77._8_8_);
              local_1f8 = blendvpd(auVar77,local_1f8,auVar40);
              auVar41._0_8_ = -(ulong)(lVar73 < local_258._0_8_);
              auVar41._8_8_ = -(ulong)(auVar77._8_8_ < local_258._8_8_);
              auVar90 = blendvpd(auVar77,local_258,auVar41);
              auVar42._0_8_ = -(ulong)(auVar69._0_8_ < auVar90._0_8_);
              auVar42._8_8_ = -(ulong)(auVar69._8_8_ < auVar90._8_8_);
              auVar90 = blendvpd(auVar69,auVar90,auVar42);
              auVar43._0_8_ = -(ulong)(auVar92._0_8_ < auVar90._0_8_);
              auVar43._8_8_ = -(ulong)(auVar92._8_8_ < auVar90._8_8_);
              auVar90 = blendvpd(auVar92,auVar90,auVar43);
              auVar44._0_8_ = -(ulong)(auVar63._0_8_ < auVar90._0_8_);
              auVar44._8_8_ = -(ulong)(auVar63._8_8_ < auVar90._8_8_);
              local_258 = blendvpd(auVar63,auVar90,auVar44);
            }
            lVar48 = *((ppVar15->field_4).trace)->trace_del_table;
            local_1c8 = auVar80._0_8_;
            uStack_1c0 = auVar80._8_8_;
            if (uVar19 < uVar25) {
              *(int *)(lVar48 + lVar30 + uVar19 * 4) = auVar77._8_4_;
            }
            bVar10 = (long)(uVar27 | 1) < lVar32;
            bVar35 = uVar19 != 0;
            if (bVar35 && bVar10) {
              *(int *)(lVar48 + lVar23 + uVar19 * 4) = auVar77._0_4_;
            }
            lVar48 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 8);
            if (uVar19 < uVar25) {
              *(int *)(lVar48 + lVar30 + uVar19 * 4) = auVar69._8_4_;
            }
            if (bVar35 && bVar10) {
              *(int *)(lVar48 + lVar23 + uVar19 * 4) = auVar69._0_4_;
            }
            lVar48 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x10);
            if (uVar19 < uVar25) {
              *(int *)(lVar48 + lVar30 + uVar19 * 4) = auVar92._8_4_;
            }
            if (bVar35 && bVar10) {
              *(int *)(lVar48 + lVar23 + uVar19 * 4) = auVar92._0_4_;
            }
            lVar48 = *(long *)((long)((ppVar15->field_4).trace)->trace_del_table + 0x18);
            if (uVar19 < uVar25) {
              *(int *)(lVar48 + lVar30 + uVar19 * 4) = auVar63._8_4_;
            }
            if (bVar35 && bVar10) {
              *(int *)(lVar48 + lVar23 + uVar19 * 4) = auVar63._0_4_;
            }
            auVar81 = ~auVar52 & auVar81;
            auVar70 = ~auVar52 & auVar70;
            lStack_120 = auVar39._8_8_;
            auVar45._0_8_ = -(ulong)(local_238 == lVar2);
            auVar45._8_8_ = -(ulong)(lStack_230 == lStack_120);
            auVar14._8_8_ = -(ulong)(lVar54 == lStack_160);
            auVar14._0_8_ = -(ulong)(auVar49._0_8_ == lVar1);
            auVar45 = auVar45 & auVar14;
            auVar91 = blendvpd(auVar91,auVar77,auVar45);
            auVar75 = ~auVar52 & auVar75;
            auVar56 = blendvpd(auVar56,auVar69,auVar45);
            auVar37 = blendvpd(auVar37,auVar92,auVar45);
            local_2b8 = blendvpd(local_2b8,auVar63,auVar45);
            ptr_01[uVar19] = lVar73;
            ptr_02[uVar19] = auVar69._0_8_;
            ptr_03[uVar19] = auVar92._0_8_;
            ptr_04[uVar19] = auVar63._0_8_;
            ptr_05[uVar19] = auVar85._0_8_;
            ptr_06[uVar19] = local_1c8;
            local_208 = auVar84._0_8_;
            uStack_200 = auVar84._8_8_;
            ptr_07[uVar19] = local_208;
            ptr_08[uVar19] = local_288._0_8_;
            auVar84._8_4_ = 0xffffffff;
            auVar84._0_8_ = 0xffffffffffffffff;
            auVar84._12_4_ = 0xffffffff;
            local_238 = local_238 + 1;
            lStack_230 = lStack_230 - auVar84._8_8_;
            uVar19 = uVar19 + 1;
            lVar73 = lVar87;
            iVar62 = lVar6;
            lVar48 = auVar64._0_8_;
            lVar55 = iVar8;
            lVar67 = auVar94._0_8_;
            lVar68 = iVar7;
            local_298 = auVar76;
            uStack_210 = uVar9;
          } while (s2Len + 1 != uVar19);
          auVar49._0_8_ = auVar49._0_8_ + 2;
          auVar49._8_8_ = lVar54 + 2;
          uStack_150 = (ulong)(uint)(gap * 2);
          local_2a8 = local_2a8 - (ulong)(uint)(gap * 2);
          lStack_2a0 = lStack_2a0 - uStack_150;
          lVar30 = lVar30 + uVar25 * 8;
          lVar23 = lVar23 + uVar25 * 8;
          uVar27 = uVar3;
        } while ((long)uVar3 < lVar32);
      }
      uVar25 = uVar18;
      uVar24 = uVar18;
      uVar27 = uVar18;
      bVar10 = true;
      do {
        uVar36 = local_2b8._0_8_;
        bVar35 = bVar10;
        if ((long)uVar24 < (long)auVar91._8_8_) {
          uVar18 = auVar37._8_8_;
          uVar25 = auVar56._8_8_;
          uVar24 = auVar91._8_8_;
          uVar27 = local_2b8._8_8_;
        }
        iVar29 = (int)uVar27;
        iVar26 = (int)uVar18;
        iVar20 = (int)uVar25;
        auVar70._8_8_ = 0;
        auVar70._0_8_ = auVar91._0_8_;
        auVar91 = auVar70 << 0x40;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = auVar56._0_8_;
        auVar56 = auVar11 << 0x40;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = auVar37._0_8_;
        auVar37 = auVar12 << 0x40;
        bVar10 = false;
        local_2b8._0_8_ = 0;
        local_2b8._8_8_ = uVar36;
      } while (bVar35);
      auVar46._8_4_ = (int)uVar34;
      auVar46._0_8_ = uVar34;
      auVar46._12_4_ = (int)(uVar34 >> 0x20);
      auVar60._0_8_ = -(ulong)((long)uVar34 < (long)local_1f8._0_8_);
      auVar60._8_8_ = -(ulong)(auVar46._8_8_ < (long)local_1f8._8_8_);
      auVar47._8_4_ = 0xffffffff;
      auVar47._0_8_ = 0xffffffffffffffff;
      auVar47._12_4_ = 0xffffffff;
      auVar53._8_4_ = (int)lVar21;
      auVar53._0_8_ = lVar21;
      auVar53._12_4_ = uVar72;
      auVar61._0_8_ = -(ulong)(lVar21 < (long)local_258._0_8_);
      auVar61._8_8_ = -(ulong)(auVar53._8_8_ < (long)local_258._8_8_);
      iVar28 = movmskpd(0,auVar61 | auVar47 ^ auVar60);
      if (iVar28 != 0) {
        *(byte *)&ppVar15->flag = (byte)ppVar15->flag | 0x40;
        uVar16 = 0;
        iVar17 = 0;
        uVar24 = 0;
        iVar20 = 0;
        iVar26 = 0;
        iVar29 = 0;
      }
      ppVar15->score = (int)uVar24;
      ppVar15->end_query = uVar16;
      ppVar15->end_ref = iVar17;
      ((ppVar15->field_4).stats)->matches = iVar20;
      ((ppVar15->field_4).stats)->similar = iVar26;
      ((ppVar15->field_4).stats)->length = iVar29;
      parasail_free(ptr_08);
      parasail_free(ptr_07);
      parasail_free(ptr_06);
      parasail_free(ptr_05);
      parasail_free(ptr_04);
      parasail_free(ptr_03);
      parasail_free(ptr_02);
      parasail_free(ptr_01);
      parasail_free(ptr_00);
      parasail_free(ptr);
      return ppVar15;
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vNegInf0;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vNegInf0 = _mm_insert_epi64_rpl(vZero, NEG_LIMIT, 1);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(16, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i case1 = vZero;
        __m128i case2 = vZero;
        __m128i vNH = vZero;
        __m128i vNM = vZero;
        __m128i vNS = vZero;
        __m128i vNL = vZero;
        __m128i vWH = vZero;
        __m128i vWM = vZero;
        __m128i vWS = vZero;
        __m128i vWL = vZero;
        __m128i vE = vNegInf0;
        __m128i vE_opn = vNegInf;
        __m128i vE_ext = vNegInf;
        __m128i vEM = vZero;
        __m128i vES = vZero;
        __m128i vEL = vZero;
        __m128i vF = vNegInf0;
        __m128i vF_opn = vNegInf;
        __m128i vF_ext = vNegInf;
        __m128i vFM = vZero;
        __m128i vFS = vZero;
        __m128i vFL = vZero;
        __m128i vJ = vJreset;
        __m128i vs1 = _mm_set_epi64x_rpl(
                s1[i+0],
                s1[i+1]);
        __m128i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_insert_epi64_rpl(vWH, -open - i*gap, 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            __m128i vNWM = vNM;
            __m128i vNWS = vNS;
            __m128i vNWL = vNL;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vNM = _mm_srli_si128(vWM, 8);
            vNM = _mm_insert_epi64_rpl(vNM, HM_pr[j], 1);
            vNS = _mm_srli_si128(vWS, 8);
            vNS = _mm_insert_epi64_rpl(vNS, HS_pr[j], 1);
            vNL = _mm_srli_si128(vWL, 8);
            vNL = _mm_insert_epi64_rpl(vNL, HL_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vFM = _mm_srli_si128(vFM, 8);
            vFM = _mm_insert_epi64_rpl(vFM, FM_pr[j], 1);
            vFS = _mm_srli_si128(vFS, 8);
            vFS = _mm_insert_epi64_rpl(vFS, FS_pr[j], 1);
            vFL = _mm_srli_si128(vFL, 8);
            vFL = _mm_insert_epi64_rpl(vFL, FL_pr[j], 1);
            vF_opn = _mm_sub_epi64(vNH, vOpen);
            vF_ext = _mm_sub_epi64(vF, vGap);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vNM, case1);
            vFS = _mm_blendv_epi8(vFS, vNS, case1);
            vFL = _mm_blendv_epi8(vFL, vNL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vE_opn = _mm_sub_epi64(vWH, vOpen);
            vE_ext = _mm_sub_epi64(vE, vGap);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vWM, case1);
            vES = _mm_blendv_epi8(vES, vWS, case1);
            vEL = _mm_blendv_epi8(vEL, vWL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vs2 = _mm_srli_si128(vs2, 8);
            vs2 = _mm_insert_epi64_rpl(vs2, s2[j], 1);
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            case1 = _mm_cmpeq_epi64(vWH, vNWH);
            case2 = _mm_cmpeq_epi64(vWH, vF);
            vWM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    _mm_add_epi64(vNWM,
                        _mm_and_si128(
                            _mm_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    _mm_add_epi64(vNWS,
                        _mm_and_si128(
                            _mm_cmpgt_epi64_rpl(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    _mm_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm_andnot_si128(cond, vWM);
                vWS = _mm_andnot_si128(cond, vWS);
                vWL = _mm_andnot_si128(cond, vWL);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm_andnot_si128(cond, vEM);
                vES = _mm_andnot_si128(cond, vES);
                vEL = _mm_andnot_si128(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            HM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWM,0);
            HS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWS,0);
            HL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWL,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            FM_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFM,0);
            FS_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFS,0);
            FL_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m128i cond_valid_I = _mm_cmpeq_epi64(vI, vILimit1);
                __m128i cond_valid_J = _mm_cmpeq_epi64(vJ, vJLimit1);
                __m128i cond_all = _mm_and_si128(cond_valid_I, cond_valid_J);
                vMaxH = _mm_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
            similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
            length= (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
        }
        vMaxH = _mm_slli_si128(vMaxH, 8);
        vMaxM = _mm_slli_si128(vMaxM, 8);
        vMaxS = _mm_slli_si128(vMaxS, 8);
        vMaxL = _mm_slli_si128(vMaxL, 8);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}